

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsay.c
# Opt level: O0

int get_option(int argc,char **argv)

{
  char *__s;
  _Bool _Var1;
  char *pcVar2;
  size_t sVar3;
  long in_RSI;
  int in_EDI;
  size_t len;
  char *str;
  int i;
  char *path;
  int local_14;
  
  message[0] = '\0';
  for (local_14 = 1; local_14 < in_EDI; local_14 = local_14 + 1) {
    __s = *(char **)(in_RSI + (long)local_14 * 8);
    if ((*__s == '-') || (*__s == '/')) {
      switch(__s[1]) {
      case 'f':
        sVar3 = strlen(*(char **)(in_RSI + (long)local_14 * 8));
        if (sVar3 < 3) {
          if (in_EDI <= local_14 + 1) {
            error_exit((char *)0x101695);
          }
          local_14 = local_14 + 1;
          strcpy(infile,*(char **)(in_RSI + (long)local_14 * 8));
        }
        else {
          strcpy(infile,(char *)(*(long *)(in_RSI + (long)local_14 * 8) + 2));
        }
        break;
      default:
        fprintf(_stderr,"invalid option -- %c\n",(ulong)(uint)(int)__s[1]);
        usage_exit();
        break;
      case 'h':
        usage_exit();
        break;
      case 'o':
        sVar3 = strlen(*(char **)(in_RSI + (long)local_14 * 8));
        if (sVar3 < 3) {
          if (in_EDI <= local_14 + 1) {
            error_exit((char *)0x10161b);
          }
          local_14 = local_14 + 1;
          strcpy(outfile,*(char **)(in_RSI + (long)local_14 * 8));
        }
        else {
          strcpy(outfile,(char *)(*(long *)(in_RSI + (long)local_14 * 8) + 2));
        }
        break;
      case 'v':
        sVar3 = strlen(*(char **)(in_RSI + (long)local_14 * 8));
        if (sVar3 < 3) {
          if (in_EDI <= local_14 + 1) {
            error_exit((char *)0x1015a1);
          }
          local_14 = local_14 + 1;
          strcpy(voice,*(char **)(in_RSI + (long)local_14 * 8));
        }
        else {
          strcpy(voice,(char *)(*(long *)(in_RSI + (long)local_14 * 8) + 2));
        }
      }
    }
    else {
      pcVar2 = (char *)strlen(message);
      path = pcVar2;
      sVar3 = strlen(__s);
      if ((char *)0x104 < pcVar2 + sVar3 + (long)(int)(uint)(pcVar2 != (char *)0x0) + 1) {
        error_exit((char *)0x10174b);
      }
      _Var1 = check_fullpath(path);
      if (_Var1) {
        strcpy(infile,__s);
      }
      else {
        if (path != (char *)0x0) {
          strcat(message," ");
        }
        strcat(message,__s);
      }
    }
  }
  return 0;
}

Assistant:

int get_option(int argc, char *argv[])
{
	message[0] = '\0';
	for (int i = 1; i < argc; i++)
	{
		char *str = argv[i];
		if (str[0] == '-' || str[0] == '/')
		{
			switch (str[1])
			{
			case 'v':
				if (strlen(argv[i]) > 2)
				{
					strcpy(voice, &argv[i][2]);
				}
				else
				{
					if (i + 1 >= argc)
					{
						error_exit("option requires an argument -- v");
					}
					strcpy(voice, argv[++i]);
				}
				break;

			case 'o':
				if (strlen(argv[i]) > 2)
				{
					strcpy(outfile, &argv[i][2]);
				}
				else
				{
					if (i + 1 >= argc)
					{
						error_exit("option requires an argument -- o");
					}
					strcpy(outfile, argv[++i]);
				}
				break;

			case 'f':
				if (strlen(argv[i]) > 2)
				{
					strcpy(infile, &argv[i][2]);
				}
				else
				{
					if (i + 1 >= argc)
					{
						error_exit("option requires an argument -- f");
					}
					strcpy(infile, argv[++i]);
				}
				break;

			case 'h':
				usage_exit();
				break;

			default:
				fprintf(stderr, "invalid option -- %c\n", str[1]);
				usage_exit();
				break;
			}
		}
		else
		{
			size_t len = strlen(message);
			if (len + (len>0 ? 1 : 0) + strlen(str) + 1> MAX_PATH)
			{
				error_exit("too long string.");
			}
			if (check_fullpath(str))
			{
				strcpy(infile, str);
			}
			else
			{
				if (len > 0)
				{
					strcat(message, " ");
				}
				strcat(message, str);
			}
		}
	}
	return 0;
}